

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_exp_param_t * vrna_exp_params(vrna_md_t *md)

{
  undefined1 local_800 [8];
  vrna_md_t md_1;
  vrna_md_t *md_local;
  
  md_1.pair[0x14]._76_8_ = md;
  if (md == (vrna_md_t *)0x0) {
    vrna_md_set_default((vrna_md_t *)local_800);
    md_local = (vrna_md_t *)get_scaled_exp_params((vrna_md_t *)local_800,-1.0);
  }
  else {
    md_local = (vrna_md_t *)get_scaled_exp_params(md,-1.0);
  }
  return (vrna_exp_param_t *)md_local;
}

Assistant:

PUBLIC vrna_exp_param_t *
vrna_exp_params(vrna_md_t *md)
{
  if (md) {
    return get_scaled_exp_params(md, -1.);
  } else {
    vrna_md_t md;
    vrna_md_set_default(&md);
    return get_scaled_exp_params(&md, -1.);
  }
}